

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O2

TPZAutoPointer<TPZMatrix<std::complex<float>_>_> __thiscall
TPZSTShiftOrigin<std::complex<float>_>::CalcMatrix
          (TPZSTShiftOrigin<std::complex<float>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *A,
          TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *B)

{
  atomic_int *paVar1;
  TPZSpectralTransform<std::complex<float>_> TVar2;
  long *plVar3;
  int iVar4;
  undefined8 *in_RCX;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar4 = (**(code **)(**(long **)*in_RCX + 0x80))();
  (**(code **)((ulong)(iVar4 != 0) * 0x20 + 0xb8 + **(long **)*in_RCX))();
  TVar2 = (TPZSpectralTransform<std::complex<float>_>)B->fRef;
  this->super_TPZSpectralTransform<std::complex<float>_> = TVar2;
  LOCK();
  paVar1 = (atomic_int *)((long)TVar2 + 8);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_38 = A[1].fRef;
  uStack_30 = 0;
  lVar5 = (B->fRef->fPointer->super_TPZBaseMatrix).fRow;
  lVar6 = 0;
  if (lVar5 < 1) {
    lVar5 = lVar6;
  }
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    plVar3 = *(long **)this->super_TPZSpectralTransform<std::complex<float>_>;
    uVar7 = (**(code **)(*plVar3 + 0x120))(plVar3,lVar6,lVar6);
    local_40 = CONCAT44((float)((ulong)uVar7 >> 0x20) - local_38._4_4_,
                        (float)uVar7 - (float)local_38);
    (**(code **)(*plVar3 + 0x118))(plVar3,lVar6,lVar6,&local_40);
  }
  return (TPZAutoPointer<TPZMatrix<std::complex<float>_>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  if (B->IsSymmetric()) B->Decompose_LDLt();
  else B->Decompose_LU();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //b-1 * shiftedA will be computed at the arnoldi iteration
  const auto &shift = Shift();
  const auto nRows = A->Rows();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}